

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

qsbr_value_view __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::get_val
          (iterator *this)

{
  bool bVar1;
  node_type nVar2;
  size_t extraout_RDX;
  iterator *in_RSI;
  qsbr_value_view qVar3;
  value_view local_40;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *local_30;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  node_ptr *node;
  value_type *e;
  iterator *this_local;
  
  this_local = this;
  bVar1 = valid(in_RSI);
  if (!bVar1) {
    __assert_fail("valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa65,
                  "qsbr_value_view unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::get_val() const [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  leaf = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
         std::
         stack<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
         ::top(&in_RSI->stack_);
  node = (node_ptr *)leaf;
  nVar2 = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                    ((basic_node_ptr<unodb::detail::olc_node_header> *)leaf);
  if (nVar2 == LEAF) {
    local_30 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
               ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>
                         ((basic_node_ptr<unodb::detail::olc_node_header> *)leaf);
    local_40 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::get_value_view
                         (local_30);
    qsbr_ptr_span<const_std::byte>::qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)this,&local_40);
    qVar3.length = extraout_RDX;
    qVar3.start.ptr = (pointer)this;
    return qVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa68,
                "qsbr_value_view unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::get_val() const [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

qsbr_value_view olc_db<Key, Value>::iterator::get_val() const noexcept {
  // Note: If the iterator is on a leaf, we return the value for
  // that leaf regardless of whether the leaf has been deleted.
  // This is part of the design semantics for the OLC ART scan.
  UNODB_DETAIL_ASSERT(valid());  // by contract
  const auto& e = stack_.top();
  const auto& node = e.node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
  const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf.
  return qsbr_ptr_span{leaf->get_value_view()};
}